

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_BinaryFuncPrecedence_Test::~ExprWriterTest_BinaryFuncPrecedence_Test
          (ExprWriterTest_BinaryFuncPrecedence_Test *this)

{
  ExprWriterTest_BinaryFuncPrecedence_Test *in_stack_00000010;
  
  ~ExprWriterTest_BinaryFuncPrecedence_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_F(ExprWriterTest, BinaryFuncPrecedence) {
  auto x1 = MakeVariable(0);
  auto e = MakeBinary(ex::ADD, x1, x1);
  CHECK_WRITE("atan2(atan2(x1, x1), x1 + x1)",
      MakeBinary(ex::ATAN2, MakeBinary(ex::ATAN2, x1, x1), e));
  CHECK_WRITE("precision(precision(x1, x1), x1 + x1)",
      MakeBinary(ex::PRECISION, MakeBinary(ex::PRECISION, x1, x1), e));
  CHECK_WRITE("round(round(x1, x1), x1 + x1)",
      MakeBinary(ex::ROUND, MakeBinary(ex::ROUND, x1, x1), e));
  CHECK_WRITE("trunc(trunc(x1, x1), x1 + x1)",
      MakeBinary(ex::TRUNC, MakeBinary(ex::TRUNC, x1, x1), e));
}